

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void Macro_smpsPitchSlide(uint arg_count,long *arg_array)

{
  if (arg_count != 0) {
    if (target_driver < 5) {
      PrintError("Error: smpsPitchSlide is only supported in Flamewing\'s driver\n");
    }
    WriteByte(0xff);
    WriteByte('\v');
    WriteByte((uchar)*arg_array);
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x43f,"void Macro_smpsPitchSlide(unsigned int, long *)");
}

Assistant:

static void Macro_smpsPitchSlide(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	if (target_driver < 5)
		PrintError("Error: smpsPitchSlide is only supported in Flamewing's driver\n");

	WriteByte(0xFF);
	WriteByte(0x0B);
	WriteByte(arg_array[0]);
}